

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# signalfd-test.c
# Opt level: O0

int main(int argc,char **argv)

{
  int iVar1;
  char **argv_local;
  int argc_local;
  
  iVar1 = microatf_tp_main(argc,argv,microatf_tp_add_tcs);
  return iVar1;
}

Assistant:

ATF_TP_ADD_TCS(tp)
{
	ATF_TP_ADD_TC(tp, signalfd__simple_signalfd);
	ATF_TP_ADD_TC(tp, signalfd__blocking_read);
	ATF_TP_ADD_TC(tp, signalfd__nonblocking_read);
	ATF_TP_ADD_TC(tp, signalfd__multiple_signals);
	ATF_TP_ADD_TC(tp, signalfd__modify_signalmask);
	ATF_TP_ADD_TC(tp, signalfd__argument_checks);
	ATF_TP_ADD_TC(tp, signalfd__signal_disposition);
	ATF_TP_ADD_TC(tp, signalfd__sigwaitinfo);
	ATF_TP_ADD_TC(tp, signalfd__sigwait_openbsd);
	ATF_TP_ADD_TC(tp, signalfd__sigchld);
	ATF_TP_ADD_TC(tp, signalfd__sigwinch);
	ATF_TP_ADD_TC(tp, signalfd__multiple_readers);

	return atf_no_error();
}